

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvavucstart.c
# Opt level: O2

int main(int argc,char **argv)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  uint uVar4;
  char *__ptr;
  int y;
  uint uVar5;
  bool bVar6;
  size_t sStack_50;
  int cnum;
  int local_38;
  uint local_34;
  
  iVar2 = nva_init();
  if (iVar2 == 0) {
    cnum = 0;
    local_38 = 1;
    local_34 = 1;
    do {
      while( true ) {
        while( true ) {
          while (iVar2 = getopt(argc,argv,"c:bvu"), iVar2 == 99) {
            __isoc99_sscanf(_optarg,"%d",&cnum);
          }
          if (iVar2 != 0x62) break;
          local_34 = 0;
        }
        if (iVar2 != 0x75) break;
        local_38 = 0;
      }
    } while (iVar2 != -1);
    if (cnum < nva_cardsnum) {
      if ((local_34 & 1) == 0) {
        if (_optind < argc) {
          __stream = fopen(argv[_optind],"rb");
          if (__stream == (FILE *)0x0) {
            fprintf(_stderr,"Binary file %s could not be opened.\n",argv[_optind]);
            return 1;
          }
          uVar4 = 0;
          fprintf(_stderr,"Uploading file %s.\n",argv[_optind]);
          pvVar1 = nva_cards[cnum]->bar0;
          *(undefined4 *)((long)pvVar1 + 0x103cfc) = 0;
          *(undefined4 *)((long)pvVar1 + 0x103288) = 0x10000;
          uVar5 = 0;
LAB_001025cf:
          do {
            bVar6 = false;
            if (uVar5 != 4) {
              uVar3 = fgetc(__stream);
              if (uVar3 != 0xffffffff) {
                uVar4 = uVar4 | (uVar3 & 0xff) << ((char)uVar5 * '\b' & 0x1fU);
                uVar5 = uVar5 + 1;
                goto LAB_001025cf;
              }
              bVar6 = uVar5 < 4;
              if (uVar5 == 0) goto LAB_00102633;
            }
            pvVar1 = nva_cards[cnum]->bar0;
            *(undefined4 *)((long)pvVar1 + 0x103cfc) = 0;
            *(uint *)((long)pvVar1 + 0x10328c) = uVar4;
            uVar4 = 0;
            uVar5 = 0;
            if (bVar6) {
LAB_00102633:
              if (local_38 == 0) {
                return 0;
              }
              pvVar1 = nva_cards[cnum]->bar0;
              *(undefined4 *)((long)pvVar1 + 0x103cfc) = 0;
              *(undefined4 *)((long)pvVar1 + 0x103288) = 0;
              return 0;
            }
          } while( true );
        }
        __ptr = "At least specify payload file.\n";
        sStack_50 = 0x1f;
      }
      else {
        __ptr = "No engine specified. Specify -b for PBSP, -v for PVP\n";
        sStack_50 = 0x35;
      }
    }
    else if (nva_cardsnum == 0) {
      __ptr = "No cards found.\n";
      sStack_50 = 0x10;
    }
    else {
      __ptr = "No such card.\n";
      sStack_50 = 0xe;
    }
  }
  else {
    __ptr = "PCI init failure!\n";
    sStack_50 = 0x12;
  }
  fwrite(__ptr,sStack_50,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	int base =0;
	int start = 1;
	while ((c = getopt (argc, argv, "c:bvu")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
			case 'b':
			    base = 0xabcd;
				break;
			case 'u':
			    start = 0;
		}

	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	if (!base) {
		fprintf (stderr, "No engine specified. Specify -b for PBSP, -v for PVP\n");
		return 1;
	}
	
	if (optind >= argc) {
	    fprintf(stderr, "At least specify payload file.\n");
	    return 1;
	}

	FILE *payload = fopen(argv[optind], "rb");
    
    if (payload == NULL) {
        fprintf(stderr, "Binary file %s could not be opened.\n", argv[optind]);
        return 1;
    } else {
        fprintf(stderr, "Uploading file %s.\n", argv[optind]);
    }
    
    int i;

    vuc_hold(cnum, 0);

	for (i = 0; ; i += 4) {
	    uint32_t word = 0;
	    int y;
	    int character = 0;
	    for (y = 0; y < 4; y++) {
    		character = fgetc(payload);
    		if (character == EOF) {
    		    break;
    		}
    		word |= ((unsigned char)character) << (y * 8);
    	}
    	if (y == 0) {
    	    break;
    	}
    	host_xt_wr32(cnum, XTENSA_VUC_CODE_ACCESS, word);
   		if (character == EOF) {
   		    break;
   		}
	}
	if (start) {
    	vuc_start(cnum, 0);
    }
	return 0;
}